

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::_set_val(Tree *this,size_t node,csubstr val,type_bits more_flags)

{
  NodeData *pNVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  NodeType_e f;
  
  sVar4 = num_children(this,node);
  if (sVar4 != 0) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    (*(code *)PTR_error_impl_0024dab8)
              ("check failed: num_children(node) == 0",0x25,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    (*(code *)PTR_error_impl_0024dab8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((this->m_buf[node].m_type.type & SEQ) == NOTYPE) {
    if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
      if ((s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      (*(code *)PTR_error_impl_0024dab8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((this->m_buf[node].m_type.type & MAP) == NOTYPE) goto LAB_001fd995;
  }
  if ((s_error_flags & 1) != 0) {
    bVar3 = is_debugger_attached();
    if (bVar3) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
  }
  (*(code *)PTR_error_impl_0024dab8)
            ("check failed: !is_seq(node) && !is_map(node)",0x2c,
             (anonymous_namespace)::s_default_callbacks);
LAB_001fd995:
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    (*(code *)PTR_error_impl_0024dab8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar1 = this->m_buf;
  pNVar1[node].m_val.scalar.str = val.str;
  pNVar1[node].m_val.scalar.len = val.len;
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    (*(code *)PTR_error_impl_0024dab8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar1 = this->m_buf;
  f = more_flags | pNVar1[node].m_type.type | VAL;
  _check_next_flags(this,node,f);
  pNVar1[node].m_type.type = f;
  return;
}

Assistant:

void _set_val(size_t node, csubstr val, type_bits more_flags=0)
    {
        RYML_ASSERT(num_children(node) == 0);
        RYML_ASSERT(!is_seq(node) && !is_map(node));
        _p(node)->m_val.scalar = val;
        _add_flags(node, VAL|more_flags);
    }